

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::initiatorFixtureinitiatorResetLogonWithResetSeqNumInResponseHelper::
~initiatorFixtureinitiatorResetLogonWithResetSeqNumInResponseHelper
          (initiatorFixtureinitiatorResetLogonWithResetSeqNumInResponseHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, initiatorResetLogonWithResetSeqNumInResponse)
{
  object->setResponder( this );
  object->next();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  CHECK_EQUAL( 2, object->getExpectedSenderNum() );
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );

  object->next( createLogout( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK_EQUAL( 3, object->getExpectedSenderNum() );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );

  object->setResetOnLogon( true );
  object->next();
  FIX42::Logon logon = createLogon( "ISLD", "TW", 1 );
  logon.set( FIX::ResetSeqNumFlag(true) );
  object->next( logon, UtcTimeStamp() );
  CHECK( object->isLoggedOn() );
}